

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_layer.c
# Opt level: O3

REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid)

{
  REF_INT RVar1;
  int iVar2;
  REF_NODE pRVar3;
  REF_CELL ref_cell;
  REF_DBL *pRVar4;
  undefined1 auVar5 [16];
  uint uVar6;
  REF_DBL *original;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined8 uVar10;
  ulong uVar11;
  int iVar12;
  long lVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  REF_INT *pRVar17;
  int iVar18;
  long lVar19;
  char *pcVar20;
  REF_EDGE pRVar21;
  undefined1 auVar22 [16];
  REF_DBL RVar23;
  undefined1 auVar24 [16];
  double dVar25;
  undefined1 auVar26 [16];
  REF_DBL e1 [3];
  REF_INT ntri;
  REF_EDGE ref_edge;
  REF_INT tri_list [2];
  REF_DBL e0 [3];
  undefined8 local_108;
  double local_100;
  double local_f8;
  REF_INT *local_e8;
  int local_dc;
  REF_EDGE local_d8;
  int local_d0;
  int local_cc;
  REF_NODE local_c8;
  long local_c0;
  long local_b8;
  REF_GRID local_b0;
  undefined8 local_a8;
  REF_INT local_a0;
  int iStack_9c;
  REF_INT local_98;
  undefined4 uStack_94;
  
  pRVar3 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  uVar6 = ref_edge_create(&local_d8,ref_grid);
  pRVar21 = local_d8;
  if (uVar6 == 0) {
    iVar14 = local_d8->n;
    lVar13 = (long)iVar14;
    local_c8 = pRVar3;
    if (lVar13 < 0) {
      pcVar20 = "malloc dots of REF_DBL negative";
      uVar10 = 0x168;
LAB_00205ef6:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",
             uVar10,"ref_layer_quad_right_triangles",pcVar20);
      return 1;
    }
    original = (REF_DBL *)malloc(lVar13 * 8);
    auVar5 = _DAT_0020f530;
    if (original == (REF_DBL *)0x0) {
      pcVar20 = "malloc dots of REF_DBL NULL";
      uVar10 = 0x168;
    }
    else {
      if (iVar14 != 0) {
        lVar7 = lVar13 + -1;
        auVar22._8_4_ = (int)lVar7;
        auVar22._0_8_ = lVar7;
        auVar22._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar22 = auVar22 ^ _DAT_0020f530;
        auVar24 = _DAT_0020f520;
        do {
          auVar26 = auVar24 ^ auVar5;
          if ((bool)(~(auVar26._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar26._0_4_ ||
                      auVar22._4_4_ < auVar26._4_4_) & 1)) {
            *(undefined8 *)((long)original + lVar7) = 0x4000000000000000;
          }
          if ((auVar26._12_4_ != auVar22._12_4_ || auVar26._8_4_ <= auVar22._8_4_) &&
              auVar26._12_4_ <= auVar22._12_4_) {
            *(undefined8 *)((long)original + lVar7 + 8) = 0x4000000000000000;
          }
          lVar8 = auVar24._8_8_;
          auVar24._0_8_ = auVar24._0_8_ + 2;
          auVar24._8_8_ = lVar8 + 2;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(iVar14 + 1U >> 1) << 4 != lVar7);
      }
      local_e8 = (REF_INT *)malloc(lVar13 * 4);
      if (local_e8 != (REF_INT *)0x0) {
        if (iVar14 == 0) {
          iVar14 = 0;
        }
        else {
          lVar13 = 0;
          local_b0 = ref_grid;
          do {
            RVar1 = pRVar21->e2n[lVar13 * 2];
            iVar14 = pRVar21->e2n[lVar13 * 2 + 1];
            uVar6 = ref_cell_list_with2(ref_cell,RVar1,iVar14,2,&local_dc,&local_d0);
            pRVar3 = local_c8;
            if (uVar6 != 0) {
              pcVar20 = "tri with2";
              uVar10 = 0x170;
              goto LAB_0020597e;
            }
            if (local_dc == 2) {
              lVar7 = (long)ref_cell->node_per;
              if (0 < lVar7) {
                lVar8 = (long)RVar1;
                iVar15 = -1;
                lVar19 = 0;
                do {
                  iVar12 = ref_cell->c2n[(long)ref_cell->size_per * (long)local_d0 + lVar19];
                  iVar2 = iVar12;
                  if (iVar12 == iVar14) {
                    iVar2 = iVar15;
                  }
                  if (iVar12 == RVar1) {
                    iVar2 = iVar15;
                  }
                  iVar15 = iVar2;
                  lVar19 = lVar19 + 1;
                } while (lVar7 != lVar19);
                if (iVar15 != -1) {
                  if (0 < ref_cell->node_per) {
                    iVar12 = -1;
                    lVar19 = 0;
                    do {
                      iVar2 = ref_cell->c2n[(long)ref_cell->size_per * (long)local_cc + lVar19];
                      iVar18 = iVar2;
                      if (iVar2 == iVar14) {
                        iVar18 = iVar12;
                      }
                      if (iVar2 == RVar1) {
                        iVar18 = iVar12;
                      }
                      iVar12 = iVar18;
                      lVar19 = lVar19 + 1;
                    } while (lVar7 != lVar19);
                    if (iVar12 != -1) {
                      pRVar4 = local_c8->real;
                      local_c0 = (long)(iVar15 * 0xf);
                      lVar7 = 0;
                      do {
                        (&local_a8)[lVar7] = pRVar4[lVar8 * 0xf + lVar7] - pRVar4[local_c0 + lVar7];
                        lVar7 = lVar7 + 1;
                      } while (lVar7 != 3);
                      local_b8 = (long)iVar14 * 0xf;
                      lVar7 = 0;
                      do {
                        (&local_108)[lVar7] =
                             pRVar4[(long)iVar14 * 0xf + lVar7] - pRVar4[local_c0 + lVar7];
                        lVar7 = lVar7 + 1;
                      } while (lVar7 != 3);
                      uVar6 = ref_math_normalize((REF_DBL *)&local_a8);
                      if (uVar6 == 0) {
                        uVar6 = ref_math_normalize((REF_DBL *)&local_108);
                        if (uVar6 == 0) {
                          RVar23 = (double)CONCAT44(uStack_94,local_98) * local_f8 +
                                   (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                                   (double)CONCAT44(local_108._4_4_,(int)local_108) +
                                   (double)CONCAT44(iStack_9c,local_a0) * local_100;
                          if (RVar23 <= -RVar23) {
                            RVar23 = -RVar23;
                          }
                          original[lVar13] = RVar23;
                          pRVar4 = pRVar3->real;
                          lVar19 = (long)(iVar12 * 0xf);
                          lVar7 = 0;
                          do {
                            (&local_a8)[lVar7] =
                                 pRVar4[lVar8 * 0xf + lVar7] - pRVar4[lVar19 + lVar7];
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 3);
                          lVar7 = 0;
                          do {
                            (&local_108)[lVar7] = pRVar4[local_b8 + lVar7] - pRVar4[lVar19 + lVar7];
                            lVar7 = lVar7 + 1;
                          } while (lVar7 != 3);
                          uVar6 = ref_math_normalize((REF_DBL *)&local_a8);
                          if (uVar6 == 0) {
                            uVar6 = ref_math_normalize((REF_DBL *)&local_108);
                            if (uVar6 == 0) {
                              dVar25 = (double)CONCAT44(uStack_94,local_98) * local_f8 +
                                       (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                                       (double)CONCAT44(local_108._4_4_,(int)local_108) +
                                       (double)CONCAT44(iStack_9c,local_a0) * local_100;
                              if (dVar25 <= -dVar25) {
                                dVar25 = -dVar25;
                              }
                              if (dVar25 <= original[lVar13]) {
                                dVar25 = original[lVar13];
                              }
                              original[lVar13] = dVar25;
                              pRVar4 = local_c8->real;
                              lVar7 = 0;
                              do {
                                (&local_a8)[lVar7] =
                                     pRVar4[local_c0 + lVar7] - pRVar4[lVar8 * 0xf + lVar7];
                                lVar7 = lVar7 + 1;
                              } while (lVar7 != 3);
                              lVar7 = 0;
                              do {
                                (&local_108)[lVar7] =
                                     pRVar4[lVar19 + lVar7] - pRVar4[lVar8 * 0xf + lVar7];
                                lVar7 = lVar7 + 1;
                              } while (lVar7 != 3);
                              uVar6 = ref_math_normalize((REF_DBL *)&local_a8);
                              if (uVar6 == 0) {
                                uVar6 = ref_math_normalize((REF_DBL *)&local_108);
                                if (uVar6 == 0) {
                                  dVar25 = (double)CONCAT44(uStack_94,local_98) * local_f8 +
                                           (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                                           (double)CONCAT44(local_108._4_4_,(int)local_108) +
                                           (double)CONCAT44(iStack_9c,local_a0) * local_100;
                                  if (dVar25 <= -dVar25) {
                                    dVar25 = -dVar25;
                                  }
                                  if (dVar25 <= original[lVar13]) {
                                    dVar25 = original[lVar13];
                                  }
                                  original[lVar13] = dVar25;
                                  pRVar4 = local_c8->real;
                                  lVar7 = 0;
                                  do {
                                    (&local_a8)[lVar7] =
                                         pRVar4[local_c0 + lVar7] - pRVar4[local_b8 + lVar7];
                                    lVar7 = lVar7 + 1;
                                  } while (lVar7 != 3);
                                  lVar7 = 0;
                                  do {
                                    (&local_108)[lVar7] =
                                         pRVar4[lVar19 + lVar7] - pRVar4[local_b8 + lVar7];
                                    lVar7 = lVar7 + 1;
                                  } while (lVar7 != 3);
                                  uVar6 = ref_math_normalize((REF_DBL *)&local_a8);
                                  if (uVar6 == 0) {
                                    uVar6 = ref_math_normalize((REF_DBL *)&local_108);
                                    if (uVar6 == 0) {
                                      dVar25 = (double)CONCAT44(uStack_94,local_98) * local_f8 +
                                               (double)CONCAT44(local_a8._4_4_,(REF_INT)local_a8) *
                                               (double)CONCAT44(local_108._4_4_,(int)local_108) +
                                               (double)CONCAT44(iStack_9c,local_a0) * local_100;
                                      if (dVar25 <= -dVar25) {
                                        dVar25 = -dVar25;
                                      }
                                      if (dVar25 <= original[lVar13]) {
                                        dVar25 = original[lVar13];
                                      }
                                      original[lVar13] = dVar25;
                                      goto LAB_00205eb1;
                                    }
                                    pcVar20 = "norm e1";
                                    uVar10 = 0x1a4;
                                  }
                                  else {
                                    pcVar20 = "norm e0";
                                    uVar10 = 0x1a3;
                                  }
                                }
                                else {
                                  pcVar20 = "norm e1";
                                  uVar10 = 0x19c;
                                }
                              }
                              else {
                                pcVar20 = "norm e0";
                                uVar10 = 0x19b;
                              }
                            }
                            else {
                              pcVar20 = "norm e1";
                              uVar10 = 0x194;
                            }
                          }
                          else {
                            pcVar20 = "norm e0";
                            uVar10 = 0x193;
                          }
                        }
                        else {
                          pcVar20 = "norm e1";
                          uVar10 = 0x18c;
                        }
                      }
                      else {
                        pcVar20 = "norm e0";
                        uVar10 = 0x18b;
                      }
                      goto LAB_0020597e;
                    }
                  }
                  pcVar20 = "n3 not found";
                  uVar10 = 0x185;
                  goto LAB_00205ef6;
                }
              }
              pcVar20 = "n2 not found";
              uVar10 = 0x17c;
              goto LAB_00205ef6;
            }
LAB_00205eb1:
            lVar13 = lVar13 + 1;
            iVar14 = local_d8->n;
            pRVar21 = local_d8;
            ref_grid = local_b0;
          } while (lVar13 < iVar14);
        }
        uVar6 = ref_sort_heap_dbl(iVar14,original,local_e8);
        if (uVar6 == 0) {
          pRVar17 = local_e8;
          pRVar21 = local_d8;
          if (0 < local_d8->n) {
            lVar13 = 0;
            do {
              iVar14 = pRVar17[lVar13];
              if (original[iVar14] <= 0.1736 && original[iVar14] != 0.1736) {
                RVar1 = local_d8->e2n[(long)iVar14 * 2];
                iVar14 = local_d8->e2n[iVar14 * 2 + 1];
                uVar6 = ref_cell_list_with2(ref_cell,RVar1,iVar14,2,&local_d0,(REF_INT *)&local_108)
                ;
                if (uVar6 != 0) {
                  pcVar20 = "tri with2";
                  uVar10 = 0x1b2;
                  goto LAB_0020597e;
                }
                pRVar17 = local_e8;
                if (local_d0 == 2) {
                  uVar11 = (ulong)ref_cell->node_per;
                  if (0 < (long)uVar11) {
                    uVar9 = 0xffffffff;
                    uVar16 = 0;
                    iVar15 = -1;
                    do {
                      iVar12 = ref_cell->c2n
                               [(long)ref_cell->size_per * (long)(int)local_108 + uVar16];
                      if (iVar12 != iVar14 && iVar12 != RVar1) {
                        uVar9 = uVar16 & 0xffffffff;
                        iVar15 = iVar12;
                      }
                      uVar16 = uVar16 + 1;
                    } while (uVar11 != uVar16);
                    if (iVar15 != -1) {
                      iVar15 = (int)uVar9;
                      if (iVar15 == -1) {
                        pcVar20 = "tn not found";
                        uVar10 = 0x1c1;
                      }
                      else {
                        if (0 < ref_cell->node_per) {
                          iVar12 = -1;
                          uVar9 = 0;
                          do {
                            iVar2 = ref_cell->c2n
                                    [(long)ref_cell->size_per * (long)local_108._4_4_ + uVar9];
                            iVar18 = iVar2;
                            if (iVar2 == iVar14) {
                              iVar18 = iVar12;
                            }
                            if (iVar2 == RVar1) {
                              iVar18 = iVar12;
                            }
                            iVar12 = iVar18;
                            uVar9 = uVar9 + 1;
                          } while (uVar11 != uVar9);
                          if (iVar12 != -1) {
                            iVar14 = (uint)(iVar15 < 1) * 3;
                            iVar18 = iVar15 + iVar14 + -1;
                            pRVar17 = ref_cell->c2n;
                            lVar7 = (long)ref_cell->size_per * (long)(int)local_108;
                            iVar2 = (int)lVar7;
                            local_a8._0_4_ = pRVar17[iVar2 + iVar14 + iVar15 + -1];
                            iVar14 = (uint)(iVar18 < 2) * 3;
                            iVar15 = iVar2 + -2 + iVar14 + iVar18;
                            local_a8._4_4_ = pRVar17[iVar15];
                            local_a0 = pRVar17[(int)((uint)(iVar14 + iVar18 + -2 < 2) * 3 + iVar15 +
                                                    -2)];
                            local_98 = pRVar17[lVar7 + 3];
                            iStack_9c = iVar12;
                            uVar6 = ref_cell_add(ref_grid->cell[6],(REF_INT *)&local_a8,&local_dc);
                            if (uVar6 == 0) {
                              uVar6 = ref_cell_remove(ref_cell,(int)local_108);
                              if (uVar6 == 0) {
                                uVar6 = ref_cell_remove(ref_cell,local_108._4_4_);
                                pRVar17 = local_e8;
                                if (uVar6 == 0) goto LAB_002061a4;
                                pcVar20 = "remove tri 1";
                                uVar10 = 0x1d9;
                              }
                              else {
                                pcVar20 = "remove tri 0";
                                uVar10 = 0x1d8;
                              }
                            }
                            else {
                              pcVar20 = "add";
                              uVar10 = 0x1d7;
                            }
                            goto LAB_0020597e;
                          }
                        }
                        pcVar20 = "n3 not found";
                        uVar10 = 0x1ca;
                      }
                      goto LAB_00205ef6;
                    }
                  }
                  pcVar20 = "n2 not found";
                  uVar10 = 0x1c0;
                  goto LAB_00205ef6;
                }
              }
LAB_002061a4:
              lVar13 = lVar13 + 1;
              pRVar21 = local_d8;
            } while (lVar13 < local_d8->n);
          }
          free(pRVar17);
          free(original);
          uVar6 = ref_edge_free(pRVar21);
          if (uVar6 == 0) {
            return 0;
          }
          pcVar20 = "free edge";
          uVar10 = 0x1df;
        }
        else {
          pcVar20 = "sort dots";
          uVar10 = 0x1a8;
        }
        goto LAB_0020597e;
      }
      pcVar20 = "malloc order of REF_INT NULL";
      uVar10 = 0x169;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar10,
           "ref_layer_quad_right_triangles",pcVar20);
    uVar6 = 2;
  }
  else {
    pcVar20 = "orig edges";
    uVar10 = 0x167;
LAB_0020597e:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_layer.c",uVar10,
           "ref_layer_quad_right_triangles",(ulong)uVar6,pcVar20);
  }
  return uVar6;
}

Assistant:

REF_FCN static REF_STATUS ref_layer_quad_right_triangles(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_EDGE ref_edge;
  REF_DBL *dots;
  REF_INT edge, *order, o;
  RSS(ref_edge_create(&ref_edge, ref_grid), "orig edges");
  ref_malloc_init(dots, ref_edge_n(ref_edge), REF_DBL, 2.0);
  ref_malloc(order, ref_edge_n(ref_edge), REF_INT);
  for (edge = 0; edge < ref_edge_n(ref_edge); edge++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    n0 = ref_edge_e2n(ref_edge, 0, edge);
    n1 = ref_edge_e2n(ref_edge, 1, edge);

    RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
    if (2 == ntri) {
      REF_INT t, cell_node, n2, n3, i;
      REF_DBL e0[3], e1[3];
      t = tri_list[0];
      n2 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n2 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n2, "n2 not found");
      t = tri_list[1];
      n3 = REF_EMPTY;
      each_ref_cell_cell_node(tri, cell_node) {
        if (ref_cell_c2n(tri, cell_node, t) != n0 &&
            ref_cell_c2n(tri, cell_node, t) != n1) {
          n3 = ref_cell_c2n(tri, cell_node, t);
        }
      }
      RAS(REF_EMPTY != n3, "n3 not found");
      /* n2 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n2);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n2);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = ABS(ref_math_dot(e0, e1));
      /* n3 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n0) - ref_node_xyz(ref_node, i, n3);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n1) - ref_node_xyz(ref_node, i, n3);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n0 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n0);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n0);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
      /* n1 corner */
      for (i = 0; i < 3; i++)
        e0[i] = ref_node_xyz(ref_node, i, n2) - ref_node_xyz(ref_node, i, n1);
      for (i = 0; i < 3; i++)
        e1[i] = ref_node_xyz(ref_node, i, n3) - ref_node_xyz(ref_node, i, n1);
      RSS(ref_math_normalize(e0), "norm e0");
      RSS(ref_math_normalize(e1), "norm e1");
      dots[edge] = MAX(ABS(ref_math_dot(e0, e1)), dots[edge]);
    }
  }
  RSS(ref_sort_heap_dbl(ref_edge_n(ref_edge), dots, order), "sort dots");

  for (o = 0; o < ref_edge_n(ref_edge); o++) {
    REF_INT n0, n1;
    REF_INT ntri, tri_list[2];
    edge = order[o];
    if (dots[edge] < 0.1736) { /* sin(10 degrees) */
      n0 = ref_edge_e2n(ref_edge, 0, edge);
      n1 = ref_edge_e2n(ref_edge, 1, edge);

      RSS(ref_cell_list_with2(tri, n0, n1, 2, &ntri, tri_list), "tri with2");
      if (2 == ntri) {
        REF_INT t, cell_node, n2, n3, tn, new_cell;
        REF_INT nodes[REF_CELL_MAX_NODE_PER];
        t = tri_list[0];
        n2 = REF_EMPTY;
        tn = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n2 = ref_cell_c2n(tri, cell_node, t);
            tn = cell_node;
          }
        }
        RAS(REF_EMPTY != n2, "n2 not found");
        RAS(REF_EMPTY != tn, "tn not found")
        t = tri_list[1];
        n3 = REF_EMPTY;
        each_ref_cell_cell_node(tri, cell_node) {
          if (ref_cell_c2n(tri, cell_node, t) != n0 &&
              ref_cell_c2n(tri, cell_node, t) != n1) {
            n3 = ref_cell_c2n(tri, cell_node, t);
          }
        }
        RAS(REF_EMPTY != n3, "n3 not found");
        tn--;
        if (tn < 0) tn += 3;
        t = tri_list[0];
        nodes[0] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[1] = ref_cell_c2n(tri, tn, t);
        tn++;
        if (tn > 2) tn -= 3;
        nodes[2] = ref_cell_c2n(tri, tn, t);
        nodes[3] = n3;
        nodes[4] = ref_cell_c2n(tri, 3, t);
        RSS(ref_cell_add(ref_grid_qua(ref_grid), nodes, &new_cell), "add");
        RSS(ref_cell_remove(tri, tri_list[0]), "remove tri 0");
        RSS(ref_cell_remove(tri, tri_list[1]), "remove tri 1");
      }
    }
  }
  ref_free(order);
  ref_free(dots);
  RSS(ref_edge_free(ref_edge), "free edge");
  return REF_SUCCESS;
}